

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagSet::add(TagSet *this,Tag *tag)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Tag>_>::value,_pair<iterator,_bool>_>
  _Var1;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  Tag *in_stack_ffffffffffffff30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>_>
  *this_00;
  string *in_stack_ffffffffffffff48;
  undefined1 local_98 [152];
  
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>_>
             *)local_98;
  Tag::getName_abi_cxx11_((Tag *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  toLower(in_stack_ffffffffffffff48);
  std::make_pair<std::__cxx11::string,Catch::Tag_const&>(&in_RDI->first,in_stack_ffffffffffffff30);
  _Var1 = std::
          map<std::__cxx11::string,Catch::Tag,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Tag>>>
          ::insert<std::pair<std::__cxx11::string,Catch::Tag>>(this_00,in_RDI);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
           *)_Var1.first._M_node._M_node);
  std::__cxx11::string::~string((string *)(local_98 + 0x20));
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void add( Tag const& tag ) {
            m_tags.insert( std::make_pair( toLower( tag.getName() ), tag ) );
        }